

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

string * __thiscall V4L2Device::make_jpeg_file_name_abi_cxx11_(V4L2Device *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool *pbVar2;
  tm *ptVar3;
  char *pcVar4;
  size_t sVar5;
  long in_RSI;
  string *in_RDI;
  time_t t;
  tm lt;
  bool use_strftime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmpl;
  int rc;
  char name [4096];
  undefined4 uVar6;
  undefined2 in_stack_ffffffffffffee1c;
  DispatchAction in_stack_ffffffffffffee1e;
  Writer *in_stack_ffffffffffffee20;
  LineNumber in_stack_ffffffffffffee28;
  allocator *paVar7;
  char *in_stack_ffffffffffffee30;
  char *pcVar8;
  undefined8 in_stack_ffffffffffffee38;
  Level level;
  Writer *in_stack_ffffffffffffee40;
  undefined7 in_stack_ffffffffffffee48;
  undefined1 in_stack_ffffffffffffee4f;
  byte bVar9;
  VerboseLevel verboseLevel;
  Options *in_stack_ffffffffffffee50;
  allocator local_1151;
  Writer local_1150;
  time_t local_10e0;
  tm local_10d8;
  allocator local_1099;
  string local_1098 [35];
  byte local_1075;
  allocator local_1061;
  string local_1040 [36];
  int local_101c;
  char local_1018 [4120];
  
  level = (Level)((ulong)in_stack_ffffffffffffee38 >> 0x30);
  local_101c = 0;
  std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffee20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffefa0,"result",&local_1061);
  cxxopts::Options::operator[]
            (in_stack_ffffffffffffee50,
             (string *)CONCAT17(in_stack_ffffffffffffee4f,in_stack_ffffffffffffee48));
  pbVar1 = cxxopts::OptionDetails::as<std::__cxx11::string>
                     ((OptionDetails *)in_stack_ffffffffffffee20);
  std::__cxx11::string::string(local_1040,(string *)pbVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffefa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1061);
  std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffee20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1098,"strftime",&local_1099);
  cxxopts::Options::operator[]
            (in_stack_ffffffffffffee50,
             (string *)CONCAT17(in_stack_ffffffffffffee4f,in_stack_ffffffffffffee48));
  pbVar2 = cxxopts::OptionDetails::as<bool>((OptionDetails *)in_stack_ffffffffffffee20);
  bVar9 = *pbVar2;
  std::__cxx11::string::~string(local_1098);
  verboseLevel = (VerboseLevel)pbVar2;
  std::allocator<char>::~allocator((allocator<char> *)&local_1099);
  local_1075 = bVar9 & 1;
  if (local_1075 == 0) {
    pcVar8 = local_1018;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_101c = snprintf(pcVar8,0xfff,pcVar4,(ulong)*(uint *)(in_RSI + 4));
  }
  else {
    local_10e0 = time((time_t *)0x0);
    ptVar3 = localtime_r(&local_10e0,&local_10d8);
    if (ptVar3 == (tm *)0x0) {
      uVar6 = 0;
      el::base::Writer::Writer
                (in_stack_ffffffffffffee40,level,in_stack_ffffffffffffee30,in_stack_ffffffffffffee28
                 ,(char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee1e,verboseLevel);
      el::base::Writer::construct(&local_1150,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<
                (in_stack_ffffffffffffee20,
                 (char (*) [21])
                 CONCAT26(in_stack_ffffffffffffee1e,CONCAT24(in_stack_ffffffffffffee1c,uVar6)));
      el::base::Writer::~Writer(in_stack_ffffffffffffee20);
    }
    pcVar8 = local_1018;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    sVar5 = strftime(pcVar8,0xfff,pcVar4,&local_10d8);
    local_101c = (int)sVar5;
  }
  if (local_101c < 1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    paVar7 = &local_1151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_1018,paVar7);
    std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  }
  std::__cxx11::string::~string(local_1040);
  return in_RDI;
}

Assistant:

std::string
    make_jpeg_file_name()
    {
        char name[PATH_MAX];
        int rc = 0;

        auto tmpl = (*options)["result"].as<std::string>();

        auto use_strftime = (*options)["strftime"].as<bool>();
        if (use_strftime) {
            struct tm lt;
            auto t = std::time(nullptr);
            if (localtime_r(&t, &lt) == nullptr) {
                LOG(ERROR) << "localtime_r() failed";
            }
            rc = strftime(name, sizeof(name) - 1, tmpl.c_str(), &lt);
        } else {
            rc = snprintf(name, sizeof(name) - 1, tmpl.c_str(), frames_taken);
        }

        return (rc > 0 ? std::string(name) : std::string());
    }